

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

void Js::JavascriptRegExp::SetLastIndexProperty
               (Var instance,CharCount lastIndex,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  RecyclableObject *object;
  Var newValue;
  double value;
  
  if ((int)lastIndex < 0) {
    value = (double)lastIndex;
    uVar3 = NumberUtilities::ToSpecial(value);
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      uVar4 = NumberUtilities::ToSpecial(value);
      if (uVar4 != 0xfff8000000000000) {
        uVar4 = NumberUtilities::ToSpecial(value);
        if (uVar4 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
    }
    newValue = (Var)(uVar3 ^ 0xfffc000000000000);
  }
  else {
    newValue = (Var)((ulong)lastIndex | 0x1000000000000);
  }
  object = VarTo<Js::RecyclableObject>(instance);
  JavascriptOperators::SetProperty
            (instance,object,0x1a2,newValue,scriptContext,
             PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible);
  return;
}

Assistant:

void JavascriptRegExp::SetLastIndexProperty(Var instance, CharCount lastIndex, ScriptContext* scriptContext)
    {
        SetLastIndexProperty(
            instance,
            JavascriptNumber::ToVar(lastIndex, scriptContext),
            scriptContext);
    }